

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_doclick(_glist *x,int xpos,int ypos,int which,int mod,int doit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _rtext *p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  t_text *y;
  _rtext *p_Var8;
  _glist *p_Var9;
  void *data;
  _outconnect *oc_00;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  int *y2p;
  undefined8 in_stack_fffffffffffffde0;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 uVar20;
  int local_1d4;
  t_object *local_1b8;
  bool local_1a9;
  int local_18c;
  byte local_171;
  int sinno;
  int soutno;
  int sinindex;
  int soutindex;
  t_float dsquare;
  t_float area;
  t_float ly2;
  t_float lx2;
  t_float ly1;
  t_float lx1;
  int inindex;
  int outindex;
  _glist *glist2;
  t_float fy;
  t_float fx;
  _outconnect *oc;
  t_linetraverser t;
  _rtext *rt_1;
  int issignal;
  int hotspot;
  int closest;
  int nout1;
  int iow;
  int width;
  int noutlet;
  _rtext *rt;
  t_text *hitobj;
  int clickreturned;
  int y2;
  int x2;
  int y1;
  int x1;
  int rightclick;
  int doublemod;
  int altmod;
  int runmode;
  int shiftmod;
  t_gobj *hitbox;
  uint local_40;
  int doit_local;
  int mod_local;
  int which_local;
  int ypos_local;
  int xpos_local;
  _glist *x_local;
  
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  x1 = 0;
  x2 = 0;
  y2 = 0;
  clickreturned = 0;
  hitobj._4_4_ = 0;
  hitobj._0_4_ = 0;
  hitbox._4_4_ = doit;
  local_40 = mod;
  doit_local = which;
  mod_local = ypos;
  which_local = xpos;
  _ypos_local = x;
  if (x->gl_editor == (t_editor *)0x0) {
    bug("editor");
  }
  else {
    altmod = mod & 1;
    local_171 = 1;
    if ((mod & 2U) == 0) {
      local_171 = (*(ushort *)&x->field_0xe8 >> 5 & 1) != 0 ^ 0xff;
    }
    doublemod = (int)(local_171 & 1);
    rightclick = mod & 4;
    y1 = mod & 8;
    *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
    if (((doit != 0) && (x->gl_editor->e_grab != (t_gobj *)0x0)) &&
       (x->gl_editor->e_keyfn != (t_glistkeyfn)0x0)) {
      (*x->gl_editor->e_keyfn)(x->gl_editor->e_grab,&s_,0.0);
      undarken_if_gatom(_ypos_local->gl_editor->e_grab);
      glist_grab(_ypos_local,(t_gobj *)0x0,(t_glistmotionfn)0x0,(t_glistkeyfn)0x0,0,0);
    }
    if (((hitbox._4_4_ != 0) && (which_local == *(int *)((pd_maininstance.pd_gui)->i_editor + 0x50))
        ) && ((mod_local == *(int *)((pd_maininstance.pd_gui)->i_editor + 0x54) &&
              (dVar17 = sys_getrealtime(),
              dVar17 - *(double *)((pd_maininstance.pd_gui)->i_editor + 0x48) < 0.25)))) {
      x1 = 1;
    }
    _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf7;
    if (hitbox._4_4_ != 0) {
      _ypos_local->gl_editor->e_grab = (t_gobj *)0x0;
      _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8;
    }
    if ((_ypos_local->gl_editor->field_0x88 & 7) == 0) {
      _ypos_local->gl_editor->e_xwas = which_local;
      _ypos_local->gl_editor->e_ywas = mod_local;
      if ((doublemod == 0) || (y1 != 0)) {
        y2p = (int *)((long)&hitobj + 4);
        _runmode = canvas_findhitbox(_ypos_local,which_local,mod_local,&x2,&y2,&clickreturned,y2p);
        if (_runmode == (t_gobj *)0x0) {
          local_1b8 = (t_object *)0x0;
        }
        else {
          local_1b8 = pd_checkobject(&_runmode->g_pd);
        }
        uVar19 = (undefined4)((ulong)y2p >> 0x20);
        uVar18 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
        if (_runmode == (t_gobj *)0x0) {
          if (y1 != 0) {
            canvas_rightclick(_ypos_local,which_local,mod_local,(t_gobj *)0x0);
          }
          uVar20 = (undefined4)((ulong)y2p >> 0x20);
          uVar19 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
          if ((doublemod == 0) && (y1 == 0)) {
            if (rightclick == 0) {
              fVar10 = (float)which_local;
              fVar11 = (float)mod_local;
              p_Var9 = glist_getcanvas(_ypos_local);
              linetraverser_start((t_linetraverser *)&oc,p_Var9);
              do {
                do {
                  oc_00 = linetraverser_next((t_linetraverser *)&oc);
                  uVar20 = (undefined4)((ulong)y2p >> 0x20);
                  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
                  if (oc_00 == (_outconnect *)0x0) goto LAB_0015db7f;
                  fVar12 = (float)t.tr_x22;
                  fVar13 = (float)t.tr_y22;
                  fVar14 = (float)t.tr_lx1;
                  fVar15 = (float)t.tr_ly1;
                  fVar16 = (fVar14 - fVar12) * (fVar11 - fVar13) +
                           -((fVar15 - fVar13) * (fVar10 - fVar12));
                } while (((((fVar14 - fVar12) * (fVar14 - fVar12) +
                           (fVar15 - fVar13) * (fVar15 - fVar13)) * 50.0 <= fVar16 * fVar16) ||
                         ((fVar14 - fVar12) * (fVar10 - fVar12) +
                          (fVar15 - fVar13) * (fVar11 - fVar13) < 0.0)) ||
                        ((fVar14 - fVar12) * (fVar14 - fVar10) +
                         (fVar15 - fVar13) * (fVar15 - fVar11) < 0.0));
                iVar5 = canvas_getindex(p_Var9,(t_gobj *)t.tr_x);
                iVar6 = canvas_getindex(p_Var9,(t_gobj *)t._16_8_);
                if (altmod != 0) {
                  if (((byte)_ypos_local->gl_editor->field_0x88 >> 5 & 1) == 0) {
                    if (hitbox._4_4_ != 0) {
                      glist_selectline(p_Var9,oc_00,iVar5,t.tr_ob._4_4_,iVar6,t.tr_inlet._4_4_);
                    }
                    canvas_setcursor(_ypos_local,6);
                    return;
                  }
                  iVar7 = _ypos_local->gl_editor->e_selectline_index1;
                  iVar1 = _ypos_local->gl_editor->e_selectline_index2;
                  iVar2 = _ypos_local->gl_editor->e_selectline_outno;
                  iVar3 = _ypos_local->gl_editor->e_selectline_inno;
                  if (((iVar5 == iVar7) && (iVar6 == iVar1)) &&
                     ((iVar2 == t.tr_ob._4_4_ && (iVar3 == t.tr_inlet._4_4_)))) {
                    if (hitbox._4_4_ != 0) {
                      glist_deselectline(_ypos_local);
                    }
                    canvas_setcursor(_ypos_local,6);
                    return;
                  }
                  if ((_ypos_local->gl_editor->e_selection == (t_selection *)0x0) &&
                     ((iVar5 == iVar7 || (iVar6 == iVar1)))) {
                    if (hitbox._4_4_ != 0) {
                      canvas_undo_add(_ypos_local,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
                      canvas_disconnect_with_undo
                                (_ypos_local,(float)iVar7,(float)iVar2,(float)iVar1,(float)iVar3);
                      canvas_disconnect_with_undo
                                (_ypos_local,(float)iVar5,(float)t.tr_ob._4_4_,(float)iVar6,
                                 (float)t.tr_inlet._4_4_);
                      canvas_connect_with_undo
                                (_ypos_local,(float)iVar5,(float)t.tr_ob._4_4_,(float)iVar1,
                                 (float)iVar3);
                      canvas_connect_with_undo
                                (_ypos_local,(float)iVar7,(float)iVar2,(float)iVar6,
                                 (float)t.tr_inlet._4_4_);
                      canvas_undo_add(_ypos_local,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
                      _ypos_local->gl_editor->e_selectline_index1 = iVar7;
                      _ypos_local->gl_editor->e_selectline_outno = iVar2;
                      _ypos_local->gl_editor->e_selectline_index2 = iVar6;
                      _ypos_local->gl_editor->e_selectline_inno = t.tr_inlet._4_4_;
                      canvas_dirty(_ypos_local,1.0);
                    }
                    canvas_setcursor(_ypos_local,6);
                    return;
                  }
                }
              } while (altmod != 0);
              if (hitbox._4_4_ != 0) {
                glist_noselect(_ypos_local);
                glist_selectline(p_Var9,oc_00,iVar5,t.tr_ob._4_4_,iVar6,t.tr_inlet._4_4_);
              }
              canvas_setcursor(_ypos_local,6);
            }
            else {
LAB_0015db7f:
              canvas_setcursor(_ypos_local,4);
              if (hitbox._4_4_ != 0) {
                if (altmod == 0) {
                  glist_noselect(_ypos_local);
                }
                pdgui_vmess((char *)0x0,"crr iiii rs",_ypos_local,"create","rectangle",
                            (ulong)(uint)which_local,CONCAT44(uVar20,mod_local),
                            CONCAT44(uVar19,which_local),mod_local,"-tags","x");
                _ypos_local->gl_editor->e_xwas = which_local;
                _ypos_local->gl_editor->e_ywas = mod_local;
                _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8 | 3;
              }
            }
          }
          else {
            canvas_setcursor(_ypos_local,0);
          }
        }
        else if (y1 == 0) {
          if (altmod == 0) {
            if ((((which_local < clickreturned + -4) || (hitobj._4_4_ + -4 <= mod_local)) ||
                (local_1b8 == (t_object *)0x0)) ||
               (((((local_1b8->te_g).g_pd)->c_wb != &text_widgetbehavior &&
                 ((local_1b8->field_0x2e & 3) != 3)) &&
                (p_Var9 = pd_checkglist((t_pd *)local_1b8), p_Var9 == (_glist *)0x0)))) {
              if (((local_1b8 == (t_object *)0x0) || (iVar5 = obj_noutlets(local_1b8), iVar5 == 0))
                 || (mod_local < hitobj._4_4_ + _ypos_local->gl_zoom * -3 + _ypos_local->gl_zoom)) {
                if (hitbox._4_4_ == 0) {
                  canvas_setcursor(_ypos_local,4);
                  return;
                }
              }
              else {
                iVar6 = clickreturned - x2;
                if (iVar5 < 2) {
                  local_1d4 = 1;
                }
                else {
                  local_1d4 = iVar5 + -1;
                }
                iVar7 = ((which_local - x2) * local_1d4 + iVar6 / 2) / iVar6;
                iVar6 = x2 + ((iVar6 + _ypos_local->gl_zoom * -7) * iVar7) / local_1d4;
                if (((iVar7 < iVar5) && (iVar6 - _ypos_local->gl_zoom <= which_local)) &&
                   (which_local <= iVar6 + _ypos_local->gl_zoom * 7 + _ypos_local->gl_zoom)) {
                  if (hitbox._4_4_ != 0) {
                    iVar6 = obj_issignaloutlet(local_1b8,iVar7);
                    _ypos_local->gl_editor->field_0x88 =
                         _ypos_local->gl_editor->field_0x88 & 0xf8 | 2;
                    _ypos_local->gl_editor->e_xwas = which_local;
                    _ypos_local->gl_editor->e_ywas = mod_local;
                    pdgui_vmess("::pdtk_canvas::cords_to_foreground","ci",_ypos_local,0);
                    iVar5 = 1;
                    if (iVar6 != 0) {
                      iVar5 = 2;
                    }
                    pdgui_vmess((char *)0x0,"crr iiii ri rs",_ypos_local,"create","line",
                                (ulong)(uint)which_local,CONCAT44(uVar19,mod_local),
                                CONCAT44(uVar18,which_local),mod_local,"-width",
                                CONCAT44(uVar20,iVar5 * _ypos_local->gl_zoom),"-tags","x");
                    return;
                  }
                  canvas_setcursor(_ypos_local,5);
                  return;
                }
                if (hitbox._4_4_ == 0) {
                  canvas_setcursor(_ypos_local,4);
                  return;
                }
              }
              if (((local_1b8 == (t_object *)0x0) ||
                  (p_Var4 = _ypos_local->gl_editor->e_textedfor, t._112_8_ = p_Var4,
                  p_Var4 == (_rtext *)0x0)) ||
                 (p_Var8 = glist_findrtext(_ypos_local,local_1b8), p_Var4 != p_Var8)) {
                iVar5 = glist_isselected(_ypos_local,_runmode);
                if (iVar5 == 0) {
                  glist_noselect(_ypos_local);
                  glist_select(_ypos_local,_runmode);
                }
                _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8 | 1;
              }
              else {
                iVar5 = 1;
                if (x1 != 0) {
                  iVar5 = 3;
                }
                rtext_mouse((_rtext *)t._112_8_,which_local - x2,mod_local - y2,iVar5);
                _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8 | 5;
                _ypos_local->gl_editor->e_xwas = x2;
                _ypos_local->gl_editor->e_ywas = y2;
              }
            }
            else if (hitbox._4_4_ == 0) {
              canvas_setcursor(_ypos_local,7);
            }
            else {
              iVar5 = glist_isselected(_ypos_local,_runmode);
              if (iVar5 == 0) {
                glist_noselect(_ypos_local);
                glist_select(_ypos_local,_runmode);
              }
              p_Var9 = _ypos_local;
              _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8 | 6;
              _ypos_local->gl_editor->e_xwas = x2;
              _ypos_local->gl_editor->e_ywas = y2;
              _ypos_local->gl_editor->e_xnew = which_local;
              _ypos_local->gl_editor->e_ynew = mod_local;
              iVar5 = glist_getindex(_ypos_local,_runmode);
              data = canvas_undo_set_apply(p_Var9,iVar5);
              canvas_undo_add(p_Var9,UNDO_APPLY,"resize",data);
            }
          }
          else if (hitbox._4_4_ != 0) {
            if (((local_1b8 == (t_object *)0x0) ||
                (p_Var4 = _ypos_local->gl_editor->e_textedfor, p_Var4 == (_rtext *)0x0)) ||
               (p_Var8 = glist_findrtext(_ypos_local,local_1b8), p_Var4 != p_Var8)) {
              iVar5 = glist_isselected(_ypos_local,_runmode);
              if (iVar5 == 0) {
                glist_select(_ypos_local,_runmode);
              }
              else {
                glist_deselect(_ypos_local,_runmode);
              }
            }
            else {
              rtext_mouse(p_Var4,which_local - x2,mod_local - y2,4);
              _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8 | 5;
              _ypos_local->gl_editor->e_xwas = x2;
              _ypos_local->gl_editor->e_ywas = y2;
            }
          }
        }
        else {
          canvas_rightclick(_ypos_local,which_local,mod_local,_runmode);
        }
      }
      else if ((_ypos_local->gl_editor->e_textedfor == (_rtext *)0x0) || (hitbox._4_4_ == 0)) {
        for (_runmode = _ypos_local->gl_list; _runmode != (t_gobj *)0x0; _runmode = _runmode->g_next
            ) {
          iVar5 = canvas_hitbox(_ypos_local,_runmode,which_local,mod_local,&x2,&y2,&clickreturned,
                                (int *)((long)&hitobj + 4));
          if (iVar5 != 0) {
            if (((local_40 & 2) == 0) ||
               (local_1a9 = true, (*(ushort *)&_ypos_local->field_0xe8 >> 5 & 1) != 0)) {
              local_1a9 = rightclick != 0;
            }
            hitobj._0_4_ = gobj_click(_runmode,_ypos_local,which_local,mod_local,altmod,
                                      (uint)local_1a9,x1,hitbox._4_4_);
            if ((uint)hitobj != 0) break;
          }
        }
        if (hitbox._4_4_ == 0) {
          if (_runmode == (t_gobj *)0x0) {
            canvas_setcursor(_ypos_local,0);
          }
          else {
            canvas_setcursor(_ypos_local,(uint)hitobj);
          }
        }
      }
      else {
        y = rtext_getowner(_ypos_local->gl_editor->e_textedfor);
        iVar5 = canvas_hitbox(_ypos_local,&y->te_g,which_local,mod_local,&x2,&y2,&clickreturned,
                              (int *)((long)&hitobj + 4));
        if (iVar5 == 0) {
          rtext_retext(_ypos_local->gl_editor->e_textedfor);
          rtext_activate(_ypos_local->gl_editor->e_textedfor,0);
        }
        else {
          if (altmod == 0) {
            local_18c = 1;
            if (x1 != 0) {
              local_18c = 3;
            }
          }
          else {
            local_18c = 4;
          }
          rtext_mouse(_ypos_local->gl_editor->e_textedfor,which_local - x2,mod_local - y2,local_18c)
          ;
          _ypos_local->gl_editor->field_0x88 = _ypos_local->gl_editor->field_0x88 & 0xf8 | 5;
          _ypos_local->gl_editor->e_xwas = x2;
          _ypos_local->gl_editor->e_ywas = y2;
        }
      }
    }
  }
  return;
}

Assistant:

static void canvas_doclick(t_canvas *x, int xpos, int ypos, int which,
    int mod, int doit)
{
    t_gobj *hitbox;
    int shiftmod, runmode, altmod, doublemod = 0, rightclick;
    int x1=0, y1=0, x2=0, y2=0, clickreturned = 0;
    t_text *hitobj;

    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }

    shiftmod = (mod & SHIFTMOD);
    runmode = ((mod & CTRLMOD) || (!x->gl_edit));
    altmod = (mod & ALTMOD);
    rightclick = (mod & RIGHTCLICK);

    EDITOR->canvas_undo_already_set_move = 0;

        /* if keyboard was grabbed, notify grabber and cancel the grab */
    if (doit && x->gl_editor->e_grab && x->gl_editor->e_keyfn)
    {
        (* x->gl_editor->e_keyfn) (x->gl_editor->e_grab, &s_, 0);
        undarken_if_gatom(x->gl_editor->e_grab);
        glist_grab(x, 0, 0, 0, 0, 0);
    }

    if (doit && xpos == EDITOR->canvas_upx &&
        ypos == EDITOR->canvas_upy &&
        sys_getrealtime() - EDITOR->canvas_upclicktime < DCLICKINTERVAL)
            doublemod = 1;
    x->gl_editor->e_lastmoved = 0;
    if (doit)
    {
        x->gl_editor->e_grab = 0;
        x->gl_editor->e_onmotion = MA_NONE;
    }
#if 0
    post("click %d %d %d %d", xpos, ypos, which, mod);
#endif

    if (x->gl_editor->e_onmotion != MA_NONE)
        return;

    x->gl_editor->e_xwas = xpos;
    x->gl_editor->e_ywas = ypos;

    if (runmode && !rightclick)
    {
            /* is a text activated ? */
        if (x->gl_editor->e_textedfor  && doit)
        {
            hitobj = rtext_getowner(x->gl_editor->e_textedfor);
            if (canvas_hitbox(x, &hitobj->te_g,
                xpos, ypos, &x1, &y1, &x2, &y2))
            {
                rtext_mouse(x->gl_editor->e_textedfor, xpos - x1, ypos - y1,
                    (shiftmod? RTEXT_SHIFT :
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN)));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
            }
            else
            {
                rtext_retext(x->gl_editor->e_textedfor);
                rtext_activate(x->gl_editor->e_textedfor, 0);
            }
            return;
        }
        for (hitbox = x->gl_list; hitbox; hitbox = hitbox->g_next)
        {
                /* check if the object wants to be clicked */
            if (canvas_hitbox(x, hitbox, xpos, ypos, &x1, &y1, &x2, &y2)
                && (clickreturned = gobj_click(hitbox, x, xpos, ypos,
                    shiftmod, ((mod & CTRLMOD) && (!x->gl_edit)) || altmod,
                        doublemod, doit)))
                            break;
        }
        if (!doit)
        {
            if (hitbox)
                canvas_setcursor(x, clickreturned);
            else canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        }
        return;
    }
        /* if not a runmode left click, fall here. */
    hitbox = canvas_findhitbox(x, xpos, ypos, &x1, &y1, &x2, &y2);
    hitobj = (hitbox ? pd_checkobject(&hitbox->g_pd) : 0);
        /* if text is activated while we're in locked state, this must
        be a number box - so if we clicked outside the box, deactivate it.
        This is a different situation from the "deselect" action below
        when we're unlocked.  */
    /* if (doit) post("%d %x %x %x", x->gl_edit, x->gl_editor->e_textedfor,
        hitobj, (hitobj ? glist_findrtext(x, hitobj) : 0));
    if (doit && (!x->gl_edit) && x->gl_editor->e_textedfor &&
        (!hitobj || (glist_findrtext(x, hitobj) != x->gl_editor->e_textedfor)))
            rtext_activate(x->gl_editor->e_textedfor, 0);   */
    if (hitbox)
    {
            /* we're in a rectangle */
        if (rightclick)
            canvas_rightclick(x, xpos, ypos, hitbox);
        else if (shiftmod)
        {
            if (doit)
            {
                t_rtext *rt;
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1, RTEXT_SHIFT);
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                    if (glist_isselected(x, hitbox))
                        glist_deselect(x, hitbox);
                    else glist_select(x, hitbox);
                }
            }
        }
        else
        {
            int noutlet;
                /* resize? only for "true" text boxes or canvases */
            if (xpos >= x2-4 && ypos < y2-4 && hitobj &&
                    (hitobj->te_pd->c_wb == &text_widgetbehavior ||
                    hitobj->te_type == T_ATOM ||
                    pd_checkglist(&hitobj->te_pd)))
            {
                if (doit)
                {
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_RESIZE;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                    x->gl_editor->e_xnew = xpos;
                    x->gl_editor->e_ynew = ypos;
                    canvas_undo_add(x, UNDO_APPLY, "resize",
                        canvas_undo_set_apply(x, glist_getindex(x, hitbox)));
                }
                else canvas_setcursor(x, CURSOR_EDITMODE_RESIZE);
            }
                /* look for an outlet */
            else if (hitobj && (noutlet = obj_noutlets(hitobj)) &&
                ypos >= y2 - (OHEIGHT*x->gl_zoom) + x->gl_zoom)
            {
                int width = x2 - x1;
                int iow = IOWIDTH * x->gl_zoom;
                int nout1 = (noutlet > 1 ? noutlet - 1 : 1);
                int closest = ((xpos-x1) * (nout1) + width/2)/width;
                int hotspot = x1 +
                    (width - iow) * closest / (nout1);
                if (closest < noutlet &&
                    xpos >= (hotspot - x->gl_zoom) &&
                    xpos <= hotspot + (iow + x->gl_zoom))
                {
                    if (doit)
                    {
                        int issignal = obj_issignaloutlet(hitobj, closest);
                        x->gl_editor->e_onmotion = MA_CONNECT;
                        x->gl_editor->e_xwas = xpos;
                        x->gl_editor->e_ywas = ypos;
                        pdgui_vmess("::pdtk_canvas::cords_to_foreground", "ci", x, 0);
                        pdgui_vmess(0, "crr iiii ri rs",
                            x, "create", "line",
                            xpos,ypos, xpos,ypos,
                            "-width", (issignal ? 2 : 1) * x->gl_zoom,
                            "-tags", "x");
                    }
                    else canvas_setcursor(x, CURSOR_EDITMODE_CONNECT);
                }
                else if (doit)
                    goto nooutletafterall;
                else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
            }
                /* not in an outlet; select and move */
            else if (doit)
            {
                t_rtext *rt;
                    /* check if the box is being text edited */
            nooutletafterall:
                if (hitobj && (rt = x->gl_editor->e_textedfor) &&
                    rt == glist_findrtext(x, hitobj))
                {
                    rtext_mouse(rt, xpos - x1, ypos - y1,
                        (doublemod ? RTEXT_DBL : RTEXT_DOWN));
                    x->gl_editor->e_onmotion = MA_DRAGTEXT;
                    x->gl_editor->e_xwas = x1;
                    x->gl_editor->e_ywas = y1;
                }
                else
                {
                        /* otherwise select and drag to displace */
                    if (!glist_isselected(x, hitbox))
                    {
                        glist_noselect(x);
                        glist_select(x, hitbox);
                    }
                    x->gl_editor->e_onmotion = MA_MOVE;
                }
            }
            else canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
        }
        return;
    }
        /* if right click doesn't hit any boxes, call rightclick
           routine anyway */
    if (rightclick)
        canvas_rightclick(x, xpos, ypos, 0);

        /* if not an editing action, and if we didn't hit a
           box, set cursor and return */
    if (runmode || rightclick)
    {
        canvas_setcursor(x, CURSOR_RUNMODE_NOTHING);
        return;
    }
        /* having failed to find a box, we try lines now. */
    if (!runmode && !altmod)
    {
        t_linetraverser t;
        t_outconnect *oc;
        t_float fx = xpos, fy = ypos;
        t_glist *glist2 = glist_getcanvas(x);
        linetraverser_start(&t, glist2);
        while ((oc = linetraverser_next(&t)))
        {
            int outindex, inindex;
            t_float lx1 = t.tr_lx1, ly1 = t.tr_ly1,
                lx2 = t.tr_lx2, ly2 = t.tr_ly2;
            t_float area = (lx2 - lx1) * (fy - ly1) -
                (ly2 - ly1) * (fx - lx1);
            t_float dsquare = (lx2-lx1) * (lx2-lx1) + (ly2-ly1) * (ly2-ly1);
            if (area * area >= 50 * dsquare) continue;
            if ((lx2-lx1) * (fx-lx1) + (ly2-ly1) * (fy-ly1) < 0) continue;
            if ((lx2-lx1) * (lx2-fx) + (ly2-ly1) * (ly2-fy) < 0) continue;
            outindex = canvas_getindex(glist2, &t.tr_ob->ob_g);
            inindex = canvas_getindex(glist2, &t.tr_ob2->ob_g);
            if (shiftmod)
            {
                int soutindex, sinindex, soutno, sinno;
                    /* if no line is selected, just add this line to the selection */
                if(!x->gl_editor->e_selectedline)
                {
                    if (doit)
                    {
                        glist_selectline(glist2, oc,
                            outindex, t.tr_outno,
                            inindex, t.tr_inno);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
                soutindex = x->gl_editor->e_selectline_index1;
                sinindex = x->gl_editor->e_selectline_index2;
                soutno = x->gl_editor->e_selectline_outno;
                sinno = x->gl_editor->e_selectline_inno;
                        /* if the hovered line is already selected, deselect it */
                if ((outindex == soutindex) && (inindex == sinindex)
                    && (soutno == t.tr_outno) && (sinno == t.tr_inno))
                {
                    if(doit)
                        glist_deselectline(x);
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }

                    /* swap selected and hovered connection */
                if ((!x->gl_editor->e_selection)
                    && ((outindex == soutindex) || (inindex == sinindex)))
                {
                    if(doit)
                    {
                        canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
                        canvas_disconnect_with_undo(x, soutindex, soutno, sinindex, sinno);
                        canvas_disconnect_with_undo(x, outindex, t.tr_outno, inindex, t.tr_inno);
                        canvas_connect_with_undo(x, outindex, t.tr_outno, sinindex, sinno);
                        canvas_connect_with_undo(x, soutindex, soutno, inindex, t.tr_inno);
                        canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);

                        x->gl_editor->e_selectline_index1 = soutindex;
                        x->gl_editor->e_selectline_outno = soutno;
                        x->gl_editor->e_selectline_index2 = inindex;
                        x->gl_editor->e_selectline_inno = t.tr_inno;

                        canvas_dirty(x, 1);
                    }
                    canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                    return;
                }
            }
            if (!shiftmod)
            {
                    /* !shiftmode: clear selection before selecting line */
                if (doit)
                {
                    glist_noselect(x);
                    glist_selectline(glist2, oc,
                        outindex, t.tr_outno,
                        inindex, t.tr_inno);
                }
                canvas_setcursor(x, CURSOR_EDITMODE_DISCONNECT);
                return;
            }
        }
    }
    canvas_setcursor(x, CURSOR_EDITMODE_NOTHING);
    if (doit)
    {
        if (!shiftmod) glist_noselect(x);
        pdgui_vmess(0, "crr iiii rs",
            x, "create", "rectangle",
            xpos,ypos, xpos,ypos,
            "-tags", "x");
        x->gl_editor->e_xwas = xpos;
        x->gl_editor->e_ywas = ypos;
        x->gl_editor->e_onmotion = MA_REGION;
    }
}